

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Option::_validate(Option *this,string *result,int index)

{
  bool bVar1;
  reference this_00;
  int in_ECX;
  Validator *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  ValidationError *err;
  int v;
  Validator *vali;
  const_iterator __end1;
  const_iterator __begin1;
  vector<CLI::Validator,_std::allocator<CLI::Validator>_> *__range1;
  string *err_msg;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar2;
  __normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
  local_38;
  undefined1 *local_30;
  uint3 in_stack_ffffffffffffffe0;
  uint uVar3;
  
  uVar3 = (uint)in_stack_ffffffffffffffe0;
  this_01 = in_RDI;
  ::std::__cxx11::string::string(in_RSI);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1ac8ca);
  if ((!bVar1) || (*(int *)&in_RSI[0xb].field_2 != 0)) {
    local_30 = (undefined1 *)((long)&in_RSI[0xb].field_2 + 8);
    local_38._M_current =
         (Validator *)
         std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::begin
                   ((vector<CLI::Validator,_std::allocator<CLI::Validator>_> *)
                    CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::end
              ((vector<CLI::Validator,_std::allocator<CLI::Validator>_> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    while (bVar1 = __gnu_cxx::
                   operator==<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
                             ((__normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
                               *)this_01,
                              (__normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
                ::operator*(&local_38);
      in_stack_ffffffffffffff5c = Validator::get_application_index(this_00);
      if ((in_stack_ffffffffffffff5c == -1) || (in_stack_ffffffffffffff5c == in_ECX)) {
        iVar2 = in_stack_ffffffffffffff5c;
        Validator::operator()(in_RDX,(string *)CONCAT44(in_ECX,uVar3));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar2,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
        ::std::__cxx11::string::~string(this_01);
        bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1aca22)
        ;
        if (!bVar1) {
          return in_RDI;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
      ::operator++(&local_38);
    }
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string Option::_validate(std::string &result, int index) const {
    std::string err_msg;
    if(result.empty() && expected_min_ == 0) {
        // an empty with nothing expected is allowed
        return err_msg;
    }
    for(const auto &vali : validators_) {
        auto v = vali.get_application_index();
        if(v == -1 || v == index) {
            try {
                err_msg = vali(result);
            } catch(const ValidationError &err) {
                err_msg = err.what();
            }
            if(!err_msg.empty())
                break;
        }
    }

    return err_msg;
}